

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.cpp
# Opt level: O3

void __thiscall Material::removeVec3Uniform(Material *this,string *uniformName)

{
  iterator __position;
  
  __position = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tvec3<float,_(glm::precision)0>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tvec3<float,_(glm::precision)0>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tvec3<float,_(glm::precision)0>_*>_>_>
               ::find(&(this->vec3Uniforms)._M_t,uniformName);
  if ((_Rb_tree_header *)__position._M_node !=
      &(this->vec3Uniforms)._M_t._M_impl.super__Rb_tree_header) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tvec3<float,_(glm::precision)0>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tvec3<float,_(glm::precision)0>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tvec3<float,_(glm::precision)0>_*>_>_>
    ::_M_erase_aux(&(this->vec3Uniforms)._M_t,(const_iterator)__position._M_node);
    return;
  }
  return;
}

Assistant:

void Material::removeVec3Uniform(std::string uniformName)
{
	std::map<std::string, glm::vec3*>::iterator it;
	it = vec3Uniforms.find(uniformName);
	if (it != vec3Uniforms.end())
	{
		vec3Uniforms.erase(it);
	}
}